

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

bool __thiscall
Remapper::remap_stage_output(Remapper *this,D3DStageIO *d3d_output,VulkanStageIO *vk_output)

{
  dxil_spv_bool dVar1;
  undefined1 local_4c [8];
  dxil_spv_vulkan_shader_stage_io c_vk_output;
  dxil_spv_d3d_shader_stage_io c_output;
  VulkanStageIO *vk_output_local;
  D3DStageIO *d3d_output_local;
  Remapper *this_local;
  
  c_vk_output._4_8_ = d3d_output->semantic;
  local_4c._0_4_ = vk_output->location;
  local_4c._4_4_ = vk_output->component;
  c_vk_output.location = vk_output->flags;
  if (this->stage_output_remapper == (dxil_spv_shader_stage_io_remapper_cb)0x0) {
    this_local._7_1_ = true;
  }
  else {
    dVar1 = (*this->stage_output_remapper)
                      (this->stage_output_userdata,
                       (dxil_spv_d3d_shader_stage_io *)&c_vk_output.component,
                       (dxil_spv_vulkan_shader_stage_io *)local_4c);
    if (dVar1 == '\x01') {
      vk_output->location = local_4c._0_4_;
      vk_output->component = local_4c._4_4_;
      vk_output->flags = c_vk_output.location;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool remap_stage_output(const D3DStageIO &d3d_output, VulkanStageIO &vk_output) override
	{
		dxil_spv_d3d_shader_stage_io c_output = { d3d_output.semantic, d3d_output.semantic_index };
		dxil_spv_vulkan_shader_stage_io c_vk_output = { vk_output.location, vk_output.component, vk_output.flags };

		if (stage_output_remapper)
		{
			if (stage_output_remapper(stage_output_userdata, &c_output, &c_vk_output) == DXIL_SPV_TRUE)
			{
				vk_output.location = c_vk_output.location;
				vk_output.component = c_vk_output.component;
				vk_output.flags = c_vk_output.flags;
				return true;
			}
			else
				return false;
		}
		else
		{
			return true;
		}
	}